

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_color nk_rgb_f(float r,float g,float b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  
  fVar4 = 1.0;
  if (b <= 1.0) {
    fVar4 = b;
  }
  uVar2 = 0xff000000;
  if (0.0 < fVar4) {
    uVar2 = (int)(fVar4 * 255.0) << 0x10 | 0xff000000;
  }
  fVar4 = 1.0;
  if (g <= 1.0) {
    fVar4 = g;
  }
  uVar3 = ((int)(fVar4 * 255.0) & 0xffU) << 8;
  if (fVar4 <= 0.0) {
    uVar3 = 0;
  }
  fVar4 = 1.0;
  if (r <= 1.0) {
    fVar4 = r;
  }
  uVar1 = (int)(fVar4 * 255.0) & 0xff;
  if (fVar4 <= 0.0) {
    uVar1 = 0;
  }
  return (nk_color)(uVar1 | uVar3 | uVar2);
}

Assistant:

NK_API struct nk_color
nk_rgb_f(float r, float g, float b)
{
    struct nk_color ret;
    ret.r = (nk_byte)(NK_SATURATE(r) * 255.0f);
    ret.g = (nk_byte)(NK_SATURATE(g) * 255.0f);
    ret.b = (nk_byte)(NK_SATURATE(b) * 255.0f);
    ret.a = 255;
    return ret;
}